

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall
CTB<RemSP>::PerformLabelingMem
          (CTB<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  ulong uVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  CTB<RemSP> *pCVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined4 uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  double dVar29;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2c0 [104];
  Mat local_258 [16];
  long local_248;
  long *local_210;
  long local_1f8;
  undefined1 local_1f0 [104];
  Mat local_188 [16];
  long local_178;
  long *local_140;
  ulong local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_120;
  CTB<RemSP> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1f0,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar22 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar22 << 0x20 | uVar22 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2c0,&local_110,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0x8;
  iVar20 = *(int *)&pMVar6->field_0xc;
  local_120 = accesses;
  RemSP::MemAlloc(((iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1) *
                  ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar22 = (ulong)*(int *)&pMVar6->field_0x8;
  local_118 = this;
  if (0 < (long)uVar22) {
    iVar4 = *(int *)&pMVar6->field_0xc;
    lVar17 = (long)iVar4;
    uVar25 = 0;
    do {
      if (0 < iVar4) {
        uVar1 = uVar25 - 1;
        uVar27 = uVar25 | 1;
        uVar24 = 0xffffffff;
        lVar16 = 0;
        iVar20 = -1;
        local_128 = uVar27;
        do {
          uVar15 = uVar1;
          switch(uVar24) {
          case 1:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) == '\0') {
              uVar24 = 1;
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(local_178 + lVar13 * uVar27 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                 uVar11 = RemSP::length_,
                 *(char *)(lVar16 + local_1f0._24_8_ + lVar21 * uVar27) != '\0')) {
                lVar13 = (long)(int)RemSP::length_;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13] + 1;
                RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar13] = uVar11;
                uVar11 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
                piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
                uVar24 = 3;
                goto LAB_001ab085;
              }
            }
            else {
              if (uVar25 == 0) {
LAB_001aa70b:
                if ((lVar16 == 0 || uVar25 == 0) ||
                   (piVar2 = (int *)(local_178 + lVar13 * uVar1 + -4 + lVar16 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar16 + -1 + local_1f0._24_8_ + lVar21 * uVar1) == '\0')) {
                  uVar11 = RemSP::length_;
                  lVar13 = (long)(int)RemSP::length_;
                  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13] =
                       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar13] + 1;
                  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar13] = uVar11;
                  uVar11 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4) =
                       uVar11;
                }
                else {
                  lVar13 = *local_210;
                  piVar2 = (int *)(lVar13 * uVar1 + local_248 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = *(long *)local_2c0._80_8_;
                  uVar24 = *(undefined4 *)(lVar21 * uVar1 + local_2c0._24_8_ + -4 + lVar16 * 4);
                  piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar24;
                }
                iVar20 = 6;
              }
              else {
                lVar26 = lVar13 * uVar1 + local_178;
                piVar2 = (int *)(lVar26 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = lVar21 * uVar1 + local_1f0._24_8_;
                if (*(char *)(lVar16 + lVar19) == '\0') {
                  if ((lVar17 <= lVar16 + 1) ||
                     (piVar2 = (int *)(lVar26 + 4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar19 + 1 + lVar16) == '\0')) goto LAB_001aa70b;
                  lVar13 = *local_210;
                  lVar18 = lVar13 * uVar1 + local_248;
                  piVar2 = (int *)(lVar18 + 4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = *(long *)local_2c0._80_8_;
                  lVar23 = lVar21 * uVar1 + local_2c0._24_8_;
                  uVar24 = *(undefined4 *)(lVar23 + 4 + lVar16 * 4);
                  lVar13 = lVar13 * uVar25 + local_248;
                  piVar2 = (int *)(lVar13 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = lVar21 * uVar25 + local_2c0._24_8_;
                  *(undefined4 *)(lVar21 + lVar16 * 4) = uVar24;
                  if ((lVar16 != 0) &&
                     (piVar2 = (int *)(lVar26 + -4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar19 + -1 + lVar16) != '\0')) {
                    piVar2 = (int *)(lVar13 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar11 = *(uint *)(lVar21 + lVar16 * 4);
                    piVar2 = (int *)(lVar18 + -4 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    RemSP::MemMerge(uVar11,*(uint *)(lVar23 + -4 + lVar16 * 4));
                  }
                  iVar20 = 5;
                }
                else {
                  lVar13 = *local_210;
                  piVar2 = (int *)(lVar13 * uVar1 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = *(long *)local_2c0._80_8_;
                  uVar24 = *(undefined4 *)(lVar21 * uVar1 + local_2c0._24_8_ + lVar16 * 4);
                  piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar24;
                  iVar20 = 4;
                }
              }
              uVar24 = 2;
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0'))
              {
                lVar13 = *local_210;
                piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = *(long *)local_2c0._80_8_;
                uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4);
                piVar2 = (int *)(lVar13 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar21 * uVar27 + local_2c0._24_8_;
                goto LAB_001aa877;
              }
            }
            break;
          case 2:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) == '\0') goto LAB_001a9a6a;
            uVar24 = 2;
            if (iVar20 == 6) {
LAB_001aa09c:
              lVar26 = *local_210;
              lVar23 = lVar26 * uVar25 + local_248;
              piVar2 = (int *)(lVar23 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar19 = *(long *)local_2c0._80_8_;
              lVar18 = lVar19 * uVar25 + local_2c0._24_8_;
              uVar5 = *(undefined4 *)(lVar18 + -4 + lVar16 * 4);
              piVar2 = (int *)(lVar23 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar18 + lVar16 * 4) = uVar5;
              if (((uVar25 == 0) || (lVar17 <= lVar16 + 1)) ||
                 (piVar2 = (int *)(local_178 + lVar13 * uVar1 + 4 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + 1 + local_1f0._24_8_ + lVar21 * uVar1) == '\0'))
              goto LAB_001aa16a;
              piVar2 = (int *)(lVar23 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              uVar11 = *(uint *)(lVar18 + lVar16 * 4);
              piVar2 = (int *)(local_248 + lVar26 * uVar1 + 4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              RemSP::MemMerge(uVar11,*(uint *)(local_2c0._24_8_ + lVar19 * uVar1 + 4 + lVar16 * 4));
              iVar20 = 5;
            }
            else if (iVar20 == 5) {
LAB_001a9cd9:
              lVar13 = *local_210 * uVar25 + local_248;
              piVar2 = (int *)(lVar13 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar21 = *(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_;
              uVar24 = *(undefined4 *)(lVar21 + -4 + lVar16 * 4);
              piVar2 = (int *)(lVar13 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar21 + lVar16 * 4) = uVar24;
              iVar20 = 5;
              uVar24 = 5;
            }
            else if (iVar20 == 4) {
              lVar26 = *local_210;
              lVar18 = lVar26 * uVar25 + local_248;
              piVar2 = (int *)(lVar18 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar19 = *(long *)local_2c0._80_8_;
              lVar23 = lVar19 * uVar25 + local_2c0._24_8_;
              uVar24 = *(undefined4 *)(lVar23 + -4 + lVar16 * 4);
              piVar2 = (int *)(lVar18 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar23 + lVar16 * 4) = uVar24;
              uVar24 = 4;
              if (uVar25 == 0) {
LAB_001aa16a:
                iVar20 = 6;
              }
              else {
                lVar14 = local_178 + lVar13 * uVar1;
                piVar2 = (int *)(lVar14 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = local_1f0._24_8_ + lVar21 * uVar1;
                bVar28 = *(char *)(lVar16 + lVar13) == '\0';
                if (bVar28) {
                  if ((lVar17 <= lVar16 + 1) ||
                     (piVar2 = (int *)(lVar14 + 4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar13 + 1 + lVar16) == '\0')) goto LAB_001aa16a;
                  piVar2 = (int *)(lVar18 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar11 = *(uint *)(lVar23 + lVar16 * 4);
                  piVar2 = (int *)(local_248 + lVar26 * uVar1 + 4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  RemSP::MemMerge(uVar11,*(uint *)(local_2c0._24_8_ + lVar19 * uVar1 + 4 +
                                                  lVar16 * 4));
LAB_001ab101:
                  uVar24 = 4;
                  iVar20 = 5;
                }
                else {
LAB_001a9a5a:
                  uVar24 = 4;
                  iVar20 = (uint)bVar28 * 2 + 4;
                }
              }
            }
LAB_001aaffa:
            if ((uVar27 < uVar22) &&
               (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0')) {
              lVar13 = *local_210;
              piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar21 = *(long *)local_2c0._80_8_;
              uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4);
              piVar2 = (int *)(lVar13 * uVar27 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = lVar21 * uVar27 + local_2c0._24_8_;
              goto LAB_001ab085;
            }
            break;
          case 3:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) == '\0') {
              uVar24 = 1;
              if (uVar27 < uVar22) {
                piVar2 = (int *)(local_178 + lVar13 * uVar27 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                cVar3 = *(char *)(lVar16 + local_1f0._24_8_ + lVar21 * uVar27);
joined_r0x001a9ed3:
                uVar24 = 1;
                if (cVar3 != '\0') {
                  lVar21 = *local_210 * uVar27 + local_248;
                  piVar2 = (int *)(lVar21 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
                  uVar11 = *(uint *)(lVar13 + -4 + lVar16 * 4);
                  piVar2 = (int *)(lVar21 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  goto LAB_001a9fe1;
                }
              }
            }
            else {
              if (uVar25 == 0) {
LAB_001aa9cc:
                lVar26 = *local_210;
                piVar2 = (int *)(lVar26 * uVar27 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = *(long *)local_2c0._80_8_;
                uVar24 = *(undefined4 *)(lVar19 * uVar27 + local_2c0._24_8_ + -4 + lVar16 * 4);
                lVar18 = lVar26 * uVar25 + local_248;
                piVar2 = (int *)(lVar18 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar23 = lVar19 * uVar25 + local_2c0._24_8_;
                *(undefined4 *)(lVar23 + lVar16 * 4) = uVar24;
                iVar20 = 6;
                if ((lVar16 != 0 && uVar25 != 0) &&
                   (piVar2 = (int *)(local_178 + lVar13 * uVar1 + -4 + lVar16 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar16 + -1 + local_1f0._24_8_ + lVar21 * uVar1) != '\0')) {
                  piVar2 = (int *)(lVar18 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar11 = *(uint *)(lVar23 + lVar16 * 4);
                  piVar2 = (int *)(local_248 + lVar26 * uVar1 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(local_2c0._24_8_ + lVar19 * uVar1 + (lVar16 + -1) * 4);
LAB_001aaa98:
                  RemSP::MemMerge(uVar11,*puVar12);
                }
              }
              else {
                lVar26 = lVar13 * uVar1 + local_178;
                piVar2 = (int *)(lVar26 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = lVar21 * uVar1 + local_1f0._24_8_;
                if (*(char *)(lVar16 + lVar19) != '\0') {
                  lVar13 = *local_210;
                  piVar2 = (int *)(lVar13 * uVar1 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = *(long *)local_2c0._80_8_;
                  uVar24 = *(undefined4 *)(lVar21 * uVar1 + local_2c0._24_8_ + lVar16 * 4);
                  lVar26 = lVar13 * uVar25 + local_248;
                  piVar2 = (int *)(lVar26 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar19 = lVar21 * uVar25 + local_2c0._24_8_;
                  *(undefined4 *)(lVar19 + lVar16 * 4) = uVar24;
                  piVar2 = (int *)(lVar26 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar11 = *(uint *)(lVar19 + lVar16 * 4);
                  piVar2 = (int *)(lVar13 * uVar27 + local_248 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(lVar21 * uVar27 + local_2c0._24_8_ + lVar16 * 4 + -4);
                  iVar20 = 4;
                  goto LAB_001aaa98;
                }
                if ((lVar17 <= lVar16 + 1) ||
                   (piVar2 = (int *)(lVar26 + 4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)(lVar19 + 1 + lVar16) == '\0')) goto LAB_001aa9cc;
                lVar13 = *local_210;
                piVar2 = (int *)(lVar13 * uVar1 + local_248 + 4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = *(long *)local_2c0._80_8_;
                uVar24 = *(undefined4 *)(lVar21 * uVar1 + local_2c0._24_8_ + 4 + lVar16 * 4);
                lVar26 = lVar13 * uVar25 + local_248;
                piVar2 = (int *)(lVar26 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = lVar21 * uVar25 + local_2c0._24_8_;
                *(undefined4 *)(lVar19 + lVar16 * 4) = uVar24;
                piVar2 = (int *)(lVar26 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar11 = *(uint *)(lVar19 + lVar16 * 4);
                piVar2 = (int *)(lVar13 * uVar27 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                RemSP::MemMerge(uVar11,*(uint *)(lVar21 * uVar27 + local_2c0._24_8_ + -4 +
                                                lVar16 * 4));
                iVar20 = 5;
                if ((lVar16 != 0) &&
                   (piVar2 = (int *)(*local_140 * uVar1 + local_178 + -4 + lVar16 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar16 + -1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) !=
                   '\0')) {
                  lVar13 = *local_210;
                  piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar21 = *(long *)local_2c0._80_8_;
                  uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4);
                  piVar2 = (int *)(lVar13 * uVar1 + local_248 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(lVar21 * uVar1 + local_2c0._24_8_ + (lVar16 + -1) * 4);
                  goto LAB_001aaa98;
                }
              }
              uVar24 = 8;
              uVar27 = local_128;
              if ((local_128 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * local_128 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * local_128 + local_1f0._24_8_) !=
                 '\0')) {
                lVar13 = *local_210;
                piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = *(long *)local_2c0._80_8_;
                uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4);
                piVar2 = (int *)(lVar13 * local_128 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar21 * local_128 + local_2c0._24_8_;
                uVar24 = 8;
                goto LAB_001ab085;
              }
            }
            break;
          case 4:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) != '\0') {
              uVar24 = 4;
              if (iVar20 == 6) goto LAB_001aa09c;
              if (iVar20 == 5) goto LAB_001a9cd9;
              if (iVar20 == 4) {
                lVar26 = *local_210;
                lVar23 = lVar26 * uVar25 + local_248;
                piVar2 = (int *)(lVar23 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = *(long *)local_2c0._80_8_;
                lVar18 = lVar19 * uVar25 + local_2c0._24_8_;
                uVar5 = *(undefined4 *)(lVar18 + -4 + lVar16 * 4);
                piVar2 = (int *)(lVar23 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar18 + lVar16 * 4) = uVar5;
                if (uVar25 != 0) {
                  lVar14 = local_178 + lVar13 * uVar1;
                  piVar2 = (int *)(lVar14 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar13 = local_1f0._24_8_ + lVar21 * uVar1;
                  bVar28 = *(char *)(lVar16 + lVar13) == '\0';
                  if (!bVar28) goto LAB_001a9a5a;
                  if ((lVar16 + 1 < lVar17) &&
                     (piVar2 = (int *)(lVar14 + 4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar13 + 1 + lVar16) != '\0')) {
                    piVar2 = (int *)(lVar23 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar11 = *(uint *)(lVar18 + lVar16 * 4);
                    piVar2 = (int *)(local_248 + lVar26 * uVar1 + 4 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    RemSP::MemMerge(uVar11,*(uint *)(local_2c0._24_8_ + lVar19 * uVar1 + 4 +
                                                    lVar16 * 4));
                    goto LAB_001ab101;
                  }
                }
                goto LAB_001aa16a;
              }
              goto LAB_001aaffa;
            }
            goto LAB_001a9a6a;
          case 5:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) != '\0') {
              lVar26 = *local_210;
              lVar18 = lVar26 * uVar25 + local_248;
              piVar2 = (int *)(lVar18 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar19 = *(long *)local_2c0._80_8_;
              lVar23 = lVar19 * uVar25 + local_2c0._24_8_;
              uVar24 = *(undefined4 *)(lVar23 + -4 + lVar16 * 4);
              piVar2 = (int *)(lVar18 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar23 + lVar16 * 4) = uVar24;
              local_1f8 = CONCAT44(local_1f8._4_4_,6);
              if (uVar25 != 0) {
                lVar13 = local_178 + lVar13 * uVar1;
                piVar2 = (int *)(lVar13 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = local_1f0._24_8_ + lVar21 * uVar1;
                bVar28 = *(char *)(lVar16 + lVar21) == '\0';
                uVar27 = local_128;
                if (bVar28) {
                  if ((lVar16 + 1 < lVar17) &&
                     (piVar2 = (int *)(lVar13 + 4 + lVar16 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar21 + 1 + lVar16) != '\0')) {
                    piVar2 = (int *)(lVar18 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar11 = *(uint *)(lVar23 + lVar16 * 4);
                    piVar2 = (int *)(local_248 + lVar26 * uVar1 + 4 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    RemSP::MemMerge(uVar11,*(uint *)(local_2c0._24_8_ + lVar19 * uVar1 + 4 +
                                                    lVar16 * 4));
                    local_1f8 = CONCAT44(local_1f8._4_4_,5);
                  }
                }
                else {
                  local_1f8 = CONCAT44(local_1f8._4_4_,(uint)bVar28 * 2 + 4);
                }
              }
              uVar24 = 4;
              iVar20 = (int)local_1f8;
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0'))
              {
                lVar13 = *local_210;
                piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = *(long *)local_2c0._80_8_;
                uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4);
                piVar2 = (int *)(lVar13 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar21 * uVar27 + local_2c0._24_8_;
                uVar24 = 4;
                goto LAB_001ab085;
              }
              break;
            }
            uVar24 = 1;
            if ((uVar22 <= uVar27) ||
               (piVar2 = (int *)(local_178 + lVar13 * uVar27 + lVar16 * 4), *piVar2 = *piVar2 + 1,
               *(char *)(lVar16 + local_1f0._24_8_ + lVar21 * uVar27) == '\0')) break;
            goto LAB_001a9d4a;
          case 6:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) != '\0') {
              if (iVar20 == 6) {
                lVar26 = *local_210;
                lVar18 = lVar26 * uVar25 + local_248;
                piVar2 = (int *)(lVar18 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar19 = *(long *)local_2c0._80_8_;
                lVar23 = lVar19 * uVar25 + local_2c0._24_8_;
                uVar24 = *(undefined4 *)(lVar23 + -4 + lVar16 * 4);
                piVar2 = (int *)(lVar18 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar23 + lVar16 * 4) = uVar24;
                uVar24 = 6;
                if (uVar25 == 0) {
                  iVar20 = 6;
                }
                else {
                  local_1f8 = local_248;
                  if (lVar16 + 1 < lVar17) {
                    piVar2 = (int *)(local_178 + lVar13 * uVar1 + 4 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    if (*(char *)(lVar16 + 1 + local_1f0._24_8_ + lVar21 * uVar1) == '\0') {
                      iVar20 = 6;
                    }
                    else {
                      piVar2 = (int *)(lVar18 + lVar16 * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar11 = *(uint *)(lVar23 + lVar16 * 4);
                      piVar2 = (int *)(local_248 + lVar26 * uVar1 + 4 + lVar16 * 4);
                      *piVar2 = *piVar2 + 1;
                      RemSP::MemMerge(uVar11,*(uint *)(local_2c0._24_8_ + lVar19 * uVar1 + 4 +
                                                      lVar16 * 4));
                      iVar20 = 5;
                    }
                  }
                  else {
                    iVar20 = 6;
                  }
                }
              }
              else {
                uVar24 = 6;
                if (iVar20 == 5) goto LAB_001a9cd9;
              }
              goto LAB_001aaffa;
            }
LAB_001a9a6a:
            uVar24 = 1;
            if ((uVar27 < uVar22) &&
               (piVar2 = (int *)(local_178 + lVar13 * uVar27 + lVar16 * 4), *piVar2 = *piVar2 + 1,
               *(char *)(lVar16 + local_1f0._24_8_ + lVar21 * uVar27) != '\0')) {
LAB_001a9d4a:
              lVar13 = *local_210;
              piVar2 = (int *)(lVar13 * uVar25 + local_248 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar21 = *(long *)local_2c0._80_8_;
              uVar11 = *(uint *)(lVar21 * uVar25 + local_2c0._24_8_ + -4 + lVar16 * 4);
              piVar2 = (int *)(lVar13 * uVar27 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
LAB_001aa091:
              lVar13 = lVar21 * uVar27 + local_2c0._24_8_;
              uVar24 = 7;
LAB_001ab085:
              *(uint *)(lVar13 + lVar16 * 4) = uVar11;
            }
            break;
          case 7:
            lVar13 = *local_140;
            piVar2 = (int *)(lVar13 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar21 = *(long *)local_1f0._80_8_;
            if (*(char *)(lVar16 + lVar21 * uVar25 + local_1f0._24_8_) == '\0') {
              uVar24 = 1;
              if (uVar27 < uVar22) {
                piVar2 = (int *)(local_178 + lVar13 * uVar27 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                cVar3 = *(char *)(lVar16 + local_1f0._24_8_ + lVar21 * uVar27);
                goto joined_r0x001a9ed3;
              }
            }
            else {
              if (uVar25 == 0) {
LAB_001a97ff:
                lVar13 = *local_210;
                piVar2 = (int *)(lVar13 * uVar27 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar21 = *(long *)local_2c0._80_8_;
                uVar24 = *(undefined4 *)(lVar21 * uVar27 + local_2c0._24_8_ + -4 + lVar16 * 4);
                piVar2 = (int *)(lVar13 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar21 * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar24;
                iVar20 = 6;
                if (lVar16 != 0 && uVar25 != 0) {
                  lVar13 = *local_140;
                  goto LAB_001aada4;
                }
              }
              else {
                piVar2 = (int *)(*local_140 * uVar1 + local_178 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) == '\0'
                   ) {
                  if ((lVar17 <= lVar16 + 1) ||
                     (piVar2 = (int *)(*local_140 * uVar1 + local_178 + 4 + lVar16 * 4),
                     *piVar2 = *piVar2 + 1,
                     *(char *)(lVar16 + 1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) ==
                     '\0')) goto LAB_001a97ff;
LAB_001aabb4:
                  piVar2 = (int *)(*local_210 * uVar1 + local_248 + 4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar24 = *(undefined4 *)
                            (*(long *)local_2c0._80_8_ * uVar1 + local_2c0._24_8_ + 4 + lVar16 * 4);
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)
                   (*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar24;
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                    lVar16 * 4);
                  piVar2 = (int *)(*local_210 * uVar27 + local_248 + -4 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  RemSP::MemMerge(uVar11,*(uint *)(*(long *)local_2c0._80_8_ * uVar27 +
                                                   local_2c0._24_8_ + -4 + lVar16 * 4));
                  iVar20 = 5;
                  if ((lVar16 == 0) ||
                     (piVar2 = (int *)(*local_140 * uVar1 + local_178 + -4 + lVar16 * 4),
                     *piVar2 = *piVar2 + 1,
                     *(char *)(lVar16 + -1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_)
                     == '\0')) goto LAB_001aae4c;
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                    lVar16 * 4);
                  iVar20 = 5;
                }
                else {
LAB_001a9b18:
                  piVar2 = (int *)(*local_210 * uVar1 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar24 = *(undefined4 *)
                            (*(long *)local_2c0._80_8_ * uVar1 + local_2c0._24_8_ + lVar16 * 4);
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)
                   (*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar24;
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                    lVar16 * 4);
                  iVar20 = 4;
                  uVar15 = uVar27;
                }
LAB_001aae09:
                uVar11 = *puVar12;
                piVar2 = (int *)(*local_210 * uVar15 + local_248 + (lVar16 + -1) * 4);
                *piVar2 = *piVar2 + 1;
                RemSP::MemMerge(uVar11,*(uint *)(uVar15 * *(long *)local_2c0._80_8_ +
                                                 local_2c0._24_8_ + (lVar16 + -1) * 4));
              }
LAB_001aae4c:
              uVar24 = 8;
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0'))
              {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                  lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
                uVar24 = 8;
                goto LAB_001ab085;
              }
            }
            break;
          case 8:
            piVar2 = (int *)(*local_140 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar25 + local_1f0._24_8_) == '\0') {
              uVar24 = 1;
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0'))
              {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + -4 +
                                  lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                goto LAB_001aa080;
              }
            }
            else {
              uVar24 = 8;
              if (iVar20 == 6) {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar5 = *(undefined4 *)
                         (*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + -4 + lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4)
                     = uVar5;
                iVar20 = 6;
                if (uVar25 != 0) {
LAB_001aa31f:
                  iVar20 = 6;
                  if ((lVar16 + 1 < lVar17) &&
                     (piVar2 = (int *)(*local_140 * uVar1 + local_178 + 4 + lVar16 * 4),
                     *piVar2 = *piVar2 + 1,
                     *(char *)(lVar16 + 1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) !=
                     '\0')) {
                    piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                      lVar16 * 4);
                    piVar2 = (int *)(*local_210 * uVar1 + local_248 + 4 + lVar16 * 4);
                    *piVar2 = *piVar2 + 1;
                    RemSP::MemMerge(uVar11,*(uint *)(*(long *)local_2c0._80_8_ * uVar1 +
                                                     local_2c0._24_8_ + 4 + lVar16 * 4));
                    iVar20 = 5;
                  }
                }
              }
              else if (iVar20 == 5) {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar24 = *(undefined4 *)
                          (*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + -4 + lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4)
                     = uVar24;
                iVar20 = 5;
                uVar24 = 5;
              }
              else if (iVar20 == 4) {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar24 = *(undefined4 *)
                          (*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + -4 + lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4)
                     = uVar24;
                uVar24 = 4;
                iVar20 = 6;
                if (uVar25 != 0) {
                  piVar2 = (int *)(*local_140 * uVar1 + local_178 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  bVar28 = *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_)
                           == '\0';
                  if (bVar28) goto LAB_001aa31f;
                  iVar20 = (uint)bVar28 * 2 + 4;
                }
              }
              if ((uVar27 < uVar22) &&
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0'))
              {
                piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                  lVar16 * 4);
                piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
                goto LAB_001ab085;
              }
            }
            break;
          case 9:
            piVar2 = (int *)(*local_140 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar25 + local_1f0._24_8_) != '\0') {
              if (uVar25 != 0) {
                piVar2 = (int *)(*local_140 * uVar1 + local_178 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) != '\0'
                   ) goto LAB_001a9b18;
                if ((lVar16 + 1 < lVar17) &&
                   (piVar2 = (int *)(*local_140 * uVar1 + local_178 + 4 + lVar16 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar16 + 1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) !=
                   '\0')) goto LAB_001aabb4;
              }
              piVar2 = (int *)(*local_210 * uVar27 + local_248 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              uVar24 = *(undefined4 *)
                        (*(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_ + -4 + lVar16 * 4);
              piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4) =
                   uVar24;
              iVar20 = 6;
              if (lVar16 != 0 && uVar25 != 0) {
                lVar13 = *local_140;
LAB_001aada4:
                iVar20 = 6;
                piVar2 = (int *)(lVar13 * uVar1 + local_178 + -4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar16 + -1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) !=
                    '\0') {
                  piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar12 = (uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ +
                                    lVar16 * 4);
                  iVar20 = 6;
                  goto LAB_001aae09;
                }
              }
              goto LAB_001aae4c;
            }
            uVar24 = 1;
            if ((uVar27 < uVar22) &&
               (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) != '\0')) {
              piVar2 = (int *)(*local_210 * uVar27 + local_248 + -4 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_ + -4 +
                                lVar16 * 4);
              piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
LAB_001a9fe1:
              uVar24 = 9;
              goto LAB_001ab085;
            }
            break;
          case 0xffffffff:
            piVar2 = (int *)(*local_140 * uVar25 + local_178 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar25 + local_1f0._24_8_) == '\0') {
              uVar24 = 1;
              if ((uVar22 <= uVar27) ||
                 (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
                 *piVar2 = *piVar2 + 1, uVar11 = RemSP::length_,
                 *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) == '\0'))
              break;
              lVar13 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13] = uVar11;
              uVar11 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
LAB_001aa080:
              lVar21 = *(long *)local_2c0._80_8_;
              goto LAB_001aa091;
            }
            if (uVar25 == 0) {
LAB_001aa55b:
              uVar11 = RemSP::length_;
              lVar13 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13] = uVar11;
              iVar20 = 6;
              uVar11 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
            }
            else {
              piVar2 = (int *)(*local_140 * uVar1 + local_178 + lVar16 * 4);
              *piVar2 = *piVar2 + 1;
              if (*(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) == '\0')
              {
                if ((lVar17 <= lVar16 + 1) ||
                   (piVar2 = (int *)(*local_140 * uVar1 + local_178 + 4 + lVar16 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar16 + 1 + *(long *)local_1f0._80_8_ * uVar1 + local_1f0._24_8_) ==
                   '\0')) goto LAB_001aa55b;
                piVar2 = (int *)(*local_210 * uVar1 + local_248 + 4 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                iVar20 = 5;
                uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar1 + local_2c0._24_8_ + 4 +
                                  lVar16 * 4);
              }
              else {
                piVar2 = (int *)(*local_210 * uVar1 + local_248 + lVar16 * 4);
                *piVar2 = *piVar2 + 1;
                iVar20 = 4;
                uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar1 + local_2c0._24_8_ + lVar16 * 4
                                  );
              }
            }
            piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4) = uVar11;
            uVar24 = 2;
            if ((uVar22 <= uVar27) ||
               (piVar2 = (int *)(*local_140 * uVar27 + local_178 + lVar16 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar16 + *(long *)local_1f0._80_8_ * uVar27 + local_1f0._24_8_) == '\0'))
            break;
            piVar2 = (int *)(*local_210 * uVar25 + local_248 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            uVar11 = *(uint *)(*(long *)local_2c0._80_8_ * uVar25 + local_2c0._24_8_ + lVar16 * 4);
            piVar2 = (int *)(*local_210 * uVar27 + local_248 + lVar16 * 4);
            *piVar2 = *piVar2 + 1;
            lVar13 = *(long *)local_2c0._80_8_ * uVar27 + local_2c0._24_8_;
LAB_001aa877:
            uVar24 = 2;
            goto LAB_001ab085;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar17);
      }
      uVar25 = uVar25 + 2;
    } while (uVar25 < uVar22);
  }
  uVar11 = RemSP::MemFlatten();
  pCVar10 = local_118;
  (local_118->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  piVar8 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_2c0._0_4_) {
    lVar17 = 0;
    do {
      if (0 < (int)local_2c0._4_4_) {
        lVar16 = *local_210;
        lVar21 = *(long *)local_2c0._80_8_ * lVar17 + local_2c0._24_8_;
        lVar13 = *local_210;
        lVar26 = 0;
        do {
          piVar2 = (int *)(lVar13 * lVar17 + local_248 + lVar26 * 4);
          *piVar2 = *piVar2 + 1;
          iVar4 = *(int *)(lVar21 + lVar26 * 4);
          piVar8[iVar4] = piVar8[iVar4] + 1;
          uVar11 = puVar7[iVar4];
          piVar2 = (int *)(lVar16 * lVar17 + local_248 + lVar26 * 4);
          *piVar2 = *piVar2 + 1;
          *(uint *)(lVar21 + lVar26 * 4) = uVar11;
          lVar26 = lVar26 + 1;
        } while (lVar26 < (int)local_2c0._4_4_);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)local_2c0._0_4_);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar9 = local_120;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_120,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_188;
  cv::sum((_InputArray *)local_108);
  *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_258;
  cv::sum((_InputArray *)local_108);
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar22 = 0;
  }
  else {
    lVar17 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar29 = 0.0;
    lVar16 = 0;
    do {
      dVar29 = dVar29 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar17 + (ulong)(lVar17 == 0) != lVar16);
    uVar22 = (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
  }
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = uVar22;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2c0);
  cv::Mat::operator=(&((pCVar10->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_258);
  cv::Mat::~Mat((Mat *)(local_2c0 + 8));
  cv::Mat::~Mat(local_188);
  cv::Mat::~Mat((Mat *)(local_1f0 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img(r,c)>0
#define CONDITION_B r+1<h && img(r + 1, c)>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img(r - 1, c - 1)>0
#define CONDITION_N2 r-1>=0 && img(r - 1, c)>0
#define CONDITION_N3 r-1>=0 && c+1<w && img(r - 1, c + 1)>0
#define CONDITION_N4 c-1>=0 && img(r, c - 1)>0
#define CONDITION_N5 c-1>=0 && r+1<h && img(r + 1, c - 1)>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // a <- n1
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // a <- n2
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // a <- n3
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // a <- n4
#define ACTION_7 img_labels(r, c) = img_labels(r + 1, c - 1); // a <- n5
#define ACTION_8 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c - 1)); // a + n1
#define ACTION_9 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c + 1)); // a + n3
#define ACTION_10 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r + 1, c - 1)); // a + n5
#define ACTION_11 img_labels(r + 1, c) = LabelsSolver::MemNewLabel(); // b new label
#define ACTION_12 img_labels(r + 1, c) = img_labels(r, c - 1); // b <- n4
#define ACTION_13 img_labels(r + 1, c) = img_labels(r + 1, c - 1); // b <- n5
#define ACTION_14 img_labels(r + 1, c) = img_labels(r, c); // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i,c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
    }